

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall
absl::log_internal::LogMessage::CopyToEncodedBuffer<(absl::log_internal::LogMessage::StringType)1>
          (LogMessage *this,string_view str)

{
  LogMessageData *pLVar1;
  bool bVar2;
  size_t sVar3;
  Span<char> *buf;
  Span<char> *in_R8;
  Span<const_char> value;
  Span<char> msg;
  Span<char> SVar4;
  Span<char> encoded_remaining_copy;
  
  buf = &encoded_remaining_copy;
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           .super__Head_base<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_false>.
           _M_head_impl;
  encoded_remaining_copy.ptr_ = (pLVar1->encoded_remaining).ptr_;
  encoded_remaining_copy.len_ = (pLVar1->encoded_remaining).len_;
  sVar3 = BufferSizeFor<>(kLengthDelimited);
  SVar4 = EncodeMessageStart(7,(uint64_t)((pointer)str._M_len + sVar3),&encoded_remaining_copy);
  value.len_ = (size_type)&encoded_remaining_copy;
  value.ptr_ = (pointer)str._M_len;
  bVar2 = EncodeBytesTruncate((log_internal *)0x1,(uint64_t)str._M_str,value,in_R8);
  if (bVar2) {
    msg.len_ = (size_type)&encoded_remaining_copy;
    msg.ptr_ = (pointer)SVar4.len_;
    EncodeMessageLength((log_internal *)SVar4.ptr_,msg,buf);
    pLVar1 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
             .super__Head_base<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_false>.
             _M_head_impl;
    (pLVar1->encoded_remaining).ptr_ = encoded_remaining_copy.ptr_;
    (pLVar1->encoded_remaining).len_ = encoded_remaining_copy.len_;
  }
  else {
    pLVar1 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
             .super__Head_base<0UL,_absl::log_internal::LogMessage::LogMessageData_*,_false>.
             _M_head_impl;
    Span<char>::remove_suffix(&pLVar1->encoded_remaining,(pLVar1->encoded_remaining).len_);
  }
  return;
}

Assistant:

void LogMessage::CopyToEncodedBuffer(absl::string_view str) {
  auto encoded_remaining_copy = data_->encoded_remaining;
  auto start = EncodeMessageStart(
      EventTag::kValue, BufferSizeFor(WireType::kLengthDelimited) + str.size(),
      &encoded_remaining_copy);
  // If the `logging.proto.Event.value` field header did not fit,
  // `EncodeMessageStart` will have zeroed `encoded_remaining_copy`'s size and
  // `EncodeStringTruncate` will fail too.
  if (EncodeStringTruncate(str_type == StringType::kLiteral
                               ? ValueTag::kStringLiteral
                               : ValueTag::kString,
                           str, &encoded_remaining_copy)) {
    // The string may have been truncated, but the field header fit.
    EncodeMessageLength(start, &encoded_remaining_copy);
    data_->encoded_remaining = encoded_remaining_copy;
  } else {
    // The field header(s) did not fit; zero `encoded_remaining` so we don't
    // write anything else later.
    data_->encoded_remaining.remove_suffix(data_->encoded_remaining.size());
  }
}